

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<bool,_bool> * __thiscall
Catch::ExprLhs<bool>::operator==
          (BinaryExpr<bool,_bool> *__return_storage_ptr__,ExprLhs<bool> *this,bool rhs)

{
  bool bVar1;
  StringRef local_30;
  
  bVar1 = this->m_lhs;
  StringRef::StringRef(&local_30,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar1 == rhs;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021d728;
  (__return_storage_ptr__->super_ITransientExpression).field_0xa = bVar1;
  (__return_storage_ptr__->m_op).m_start = local_30.m_start;
  (__return_storage_ptr__->m_op).m_size = local_30.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( bool rhs ) -> BinaryExpr<LhsT, bool> const {
            return { m_lhs == rhs, m_lhs, "==", rhs };
        }